

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O3

int __thiscall uWS::Group<false>::close(Group<false> *this,int __fd)

{
  uv_async_t *puVar1;
  int extraout_EAX;
  int iVar2;
  anon_class_24_3_b2829661 local_20;
  
  local_20.code = __fd;
  forEach<uWS::Group<false>::close(int,char*,unsigned_long)::_lambda(uWS::WebSocket<false>)_1_>
            (this,&local_20);
  puVar1 = (this->super_NodeData).async;
  iVar2 = extraout_EAX;
  if (puVar1 != (uv_async_t *)0x0) {
    iVar2 = uv_close(puVar1,stopListening::anon_class_1_0_00000001::__invoke);
  }
  if (this->timer != (uv_timer_t *)0x0) {
    uv_timer_stop();
    iVar2 = uv_close(this->timer,close::anon_class_1_0_00000001::__invoke);
  }
  return iVar2;
}

Assistant:

void Group<isServer>::close(int code, char *message, size_t length) {
    forEach([code, message, length](uWS::WebSocket<isServer> ws) {
        ws.close(code, message, length);
    });
    stopListening();
    if (timer) {
        uv_timer_stop(timer);
        uv_close((uv_handle_t *) timer, [](uv_handle_t *handle) {
            delete (uv_timer_t *) handle;
        });
    }
}